

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O2

void __thiscall OPN2::OPN2(OPN2 *this)

{
  (this->m_chips).
  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chips).
  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chips).
  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_regLFOSetup = '\0';
  BasicBankMap<OPN2::Bank>::BasicBankMap(&this->m_insBanks);
  this->m_numChips = 1;
  this->m_scaleModulators = false;
  this->m_runAtPcmRate = false;
  this->m_softPanning = false;
  this->m_masterVolume = '\x7f';
  this->m_musicMode = MODE_MIDI;
  this->m_volumeScale = VOLUME_Generic;
  this->m_channelAlloc = OPNMIDI_ChanAlloc_AUTO;
  this->m_lfoEnable = false;
  this->m_lfoFrequency = '\0';
  (this->m_insBankSetup).volumeModel = 0;
  (this->m_insBankSetup).lfoEnable = 0;
  (this->m_insBankSetup).lfoFrequency = 0;
  (this->m_insBankSetup).chipType = 0;
  (this->m_insBankSetup).mt32defaults = false;
  (this->m_channelCategory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_channelCategory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_channelCategory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_channelCategory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  BasicBankMap<OPN2::Bank>::clear(&this->m_insBanks);
  return;
}

Assistant:

OPN2::OPN2() :
    m_regLFOSetup(0),
    m_numChips(1),
    m_scaleModulators(false),
    m_runAtPcmRate(false),
    m_softPanning(false),
    m_masterVolume(MasterVolumeDefault),
    m_musicMode(MODE_MIDI),
    m_volumeScale(VOLUME_Generic),
    m_channelAlloc(OPNMIDI_ChanAlloc_AUTO),
    m_lfoEnable(false),
    m_lfoFrequency(0),
    m_chipFamily(OPNChip_OPN2)
{
    m_insBankSetup.volumeModel = OPN2::VOLUME_Generic;
    m_insBankSetup.lfoEnable = false;
    m_insBankSetup.lfoFrequency = 0;
    m_insBankSetup.chipType = OPNChip_OPN2;
    m_insBankSetup.mt32defaults = false;

    // Initialize blank instruments banks
    m_insBanks.clear();
}